

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverApi.c
# Opt level: O0

void Msat_SolverPrepare(Msat_Solver_t *p,Msat_IntVec_t *vVars)

{
  int local_1c;
  int i;
  Msat_IntVec_t *vVars_local;
  Msat_Solver_t *p_local;
  
  for (local_1c = 0; local_1c < p->nVarsAlloc; local_1c = local_1c + 1) {
    p->pAssigns[local_1c] = -1;
    p->pReasons[local_1c] = (Msat_Clause_t *)0x0;
    p->pLevel[local_1c] = -1;
    p->pdActivity[local_1c] = 0.0;
  }
  Msat_OrderClean(p->pOrder,vVars);
  Msat_QueueClear(p->pQueue);
  Msat_IntVecClear(p->vTrail);
  Msat_IntVecClear(p->vTrailLim);
  p->dProgress = 0.0;
  return;
}

Assistant:

void Msat_SolverPrepare( Msat_Solver_t * p, Msat_IntVec_t * vVars )
{

    int i;
    // undo the previous data
    for ( i = 0; i < p->nVarsAlloc; i++ )
    {
        p->pAssigns[i]   = MSAT_VAR_UNASSIGNED;
        p->pReasons[i]   = NULL;
        p->pLevel[i]     = -1;
        p->pdActivity[i] = 0.0;
    }

    // set the new variable order
    Msat_OrderClean( p->pOrder, vVars );

    Msat_QueueClear( p->pQueue );
    Msat_IntVecClear( p->vTrail );
    Msat_IntVecClear( p->vTrailLim );
    p->dProgress = 0.0;
}